

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
::remove_value(btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
               *this,int i,allocator_type *alloc)

{
  ulong i_00;
  undefined8 uVar1;
  btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
  bVar2;
  btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
  *pbVar3;
  long lVar4;
  size_type i_01;
  ulong i_02;
  
  if (((ulong)this & 7) == 0) {
    if ((this[0xb] ==
         (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
          )0x0) && (i + 1 < (int)(uint)(byte)this[10])) {
      i_02 = (ulong)(i + 1);
      pbVar3 = child(this,i_02);
      if (((ulong)pbVar3 & 7) != 0) goto LAB_0020d02b;
      if (pbVar3[10] !=
          (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
           )0x0) {
        __assert_fail("child(i + 1)->count() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x869,
                      "void phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>>::remove_value(const int, allocator_type *) [Params = phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>]"
                     );
      }
      i_01 = (size_type)(byte)this[10];
      if (i_02 < i_01) {
        do {
          i_00 = i_02 + 1;
          pbVar3 = child(this,i_00);
          set_child(this,i_02,pbVar3);
          i_01 = (size_type)(byte)this[10];
          i_02 = i_00;
        } while (i_00 < i_01);
      }
      mutable_child(this,i_01);
    }
    lVar4 = (long)i * 0x10;
    bVar2 = this[10];
    if (this + lVar4 + 0x20 != this + (ulong)(byte)bVar2 * 0x10 + 0x10) {
      do {
        uVar1 = *(undefined8 *)(this + lVar4 + 0x20 + 8);
        *(undefined8 *)(this + lVar4 + 0x10) = *(undefined8 *)(this + lVar4 + 0x20);
        *(undefined8 *)(this + lVar4 + 0x10 + 8) = uVar1;
        lVar4 = lVar4 + 0x10;
      } while ((ulong)(byte)bVar2 * 0x10 + -0x10 != lVar4);
      bVar2 = this[10];
    }
    this[10] = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                )((char)bVar2 - 1);
    return;
  }
LAB_0020d02b:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<long, long>, phmap::priv::btree_node<phmap::priv::map_params<long, long, phmap::Less<long>, std::allocator<std::pair<const long, long>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

inline void btree_node<P>::remove_value(const int i, allocator_type *alloc) {
        if (!leaf() && count() > i + 1) {
            assert(child(i + 1)->count() == 0);
            for (size_type j = i + 1; j < count(); ++j) {
                set_child(j, child(j + 1));
            }
            clear_child(count());
        }

        remove_values_ignore_children(i, /*to_erase=*/1, alloc);
    }